

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *rpaths)

{
  cmRuntimeDependencyArchive *this_00;
  pointer this_01;
  bool bVar1;
  byte bVar2;
  int iVar3;
  cmUVProcessChainBuilder *this_02;
  ostream *poVar4;
  istream *piVar5;
  char *pcVar6;
  reference ppSVar7;
  string local_8b8;
  undefined1 local_898 [8];
  ostringstream e_2;
  undefined1 local_720 [8];
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  undefined1 local_6e8 [8];
  ostringstream e_1;
  allocator<char> local_569;
  string local_568;
  string local_548;
  undefined1 local_528 [8];
  RegularExpressionMatch nameMatch;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  undefined1 local_410 [8];
  RegularExpressionMatch pathMatch;
  string local_360;
  undefined1 local_340 [8];
  RegularExpressionMatch cmdMatch;
  string line;
  undefined1 local_258 [8];
  ostringstream e;
  undefined1 local_e0 [8];
  cmUVProcessChain process;
  cmUVProcessChainBuilder builder;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rpaths_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *libs_local;
  string *file_local;
  cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this_local;
  
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)rpaths;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  this_00 = (this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool).Archive;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"otool",&local_69);
  bVar1 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,&local_68,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48,
               (char (*) [3])0x8b5f1c);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48,file);
    cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)&process);
    this_02 = cmUVProcessChainBuilder::SetBuiltinStream
                        ((cmUVProcessChainBuilder *)&process,Stream_OUTPUT);
    cmUVProcessChainBuilder::AddCommand
              (this_02,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_48);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_e0);
    bVar1 = cmUVProcessChain::Valid((cmUVProcessChain *)local_e0);
    if (bVar1) {
      std::__cxx11::string::string((string *)&cmdMatch.searchstring);
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::rpathRegex == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::rpathRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression(&GetFileInfo::rpathRegex,"^ *cmd LC_RPATH$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::rpathRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::loadDylibRegex == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::loadDylibRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::loadDylibRegex,"^ *cmd LC_LOAD_DYLIB$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::loadDylibRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::loadDylibRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::pathRegex == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::pathRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::pathRegex,"^ *path (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::pathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::pathRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::nameRegex == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::nameRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::nameRegex,"^ *name (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::nameRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::nameRegex);
      }
LAB_005d515d:
      piVar5 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_e0);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar5,(string *)&cmdMatch.searchstring);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (bVar1) {
        cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_340);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find
                          (&GetFileInfo::rpathRegex,pcVar6,(RegularExpressionMatch *)local_340);
        if (bVar1) {
          piVar5 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_e0);
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (piVar5,(string *)&cmdMatch.searchstring);
          bVar2 = std::ios::operator!((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
          if ((bVar2 & 1) != 0) {
LAB_005d52bb:
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_360,"Invalid output from otool",
                       (allocator<char> *)((long)&pathMatch.searchstring + 7));
            cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                      (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_360);
            std::__cxx11::string::~string((string *)&local_360);
            std::allocator<char>::~allocator((allocator<char> *)((long)&pathMatch.searchstring + 7))
            ;
            this_local._7_1_ = false;
            builder.Processes.
            super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            goto LAB_005d5a65;
          }
          piVar5 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_e0);
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (piVar5,(string *)&cmdMatch.searchstring);
          bVar2 = std::ios::operator!((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
          if ((bVar2 & 1) != 0) goto LAB_005d52bb;
          cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_410)
          ;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::RegularExpression::find
                            (&GetFileInfo::pathRegex,pcVar6,(RegularExpressionMatch *)local_410);
          this_01 = command.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_450,"Invalid output from otool",&local_451);
            cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                      (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_450);
            std::__cxx11::string::~string((string *)&local_450);
            std::allocator<char>::~allocator(&local_451);
            this_local._7_1_ = false;
            builder.Processes.
            super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            goto LAB_005d5a65;
          }
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_430,(RegularExpressionMatch *)local_410,1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_01,&local_430);
          std::__cxx11::string::~string((string *)&local_430);
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::RegularExpression::find
                            (&GetFileInfo::loadDylibRegex,pcVar6,(RegularExpressionMatch *)local_340
                            );
          if (bVar1) {
            piVar5 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_e0);
            piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               (piVar5,(string *)&cmdMatch.searchstring);
            bVar2 = std::ios::operator!((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
            if ((bVar2 & 1) == 0) {
              piVar5 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_e0);
              piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 (piVar5,(string *)&cmdMatch.searchstring);
              bVar2 = std::ios::operator!((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
              if ((bVar2 & 1) == 0) {
                cmsys::RegularExpressionMatch::RegularExpressionMatch
                          ((RegularExpressionMatch *)local_528);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                bVar1 = cmsys::RegularExpression::find
                                  (&GetFileInfo::nameRegex,pcVar6,
                                   (RegularExpressionMatch *)local_528);
                if (!bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_568,"Invalid output from otool",&local_569);
                  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                            (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_568)
                  ;
                  std::__cxx11::string::~string((string *)&local_568);
                  std::allocator<char>::~allocator(&local_569);
                  this_local._7_1_ = false;
                  builder.Processes.
                  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                  goto LAB_005d5a65;
                }
                cmsys::RegularExpressionMatch::match_abi_cxx11_
                          (&local_548,(RegularExpressionMatch *)local_528,1);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(libs,&local_548);
                std::__cxx11::string::~string((string *)&local_548);
                goto LAB_005d515d;
              }
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_478,"Invalid output from otool",
                       (allocator<char> *)((long)&nameMatch.searchstring + 7));
            cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                      (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_478);
            std::__cxx11::string::~string((string *)&local_478);
            std::allocator<char>::~allocator((allocator<char> *)((long)&nameMatch.searchstring + 7))
            ;
            this_local._7_1_ = false;
            builder.Processes.
            super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            goto LAB_005d5a65;
          }
        }
        goto LAB_005d515d;
      }
      bVar1 = cmUVProcessChain::Wait((cmUVProcessChain *)local_e0,-1);
      if (bVar1) {
        cmUVProcessChain::GetStatus
                  ((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                    *)local_720,(cmUVProcessChain *)local_e0);
        ppSVar7 = std::
                  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  ::operator[]((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                *)local_720,0);
        if ((*ppSVar7 == (value_type)0x0) ||
           (ppSVar7 = std::
                      vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                      ::operator[]((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                    *)local_720,0), (*ppSVar7)->ExitStatus != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_898);
          poVar4 = std::operator<<((ostream *)local_898,"Failed to run otool on:\n  ");
          std::operator<<(poVar4,(string *)file);
          std::__cxx11::ostringstream::str();
          cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                    (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_8b8);
          std::__cxx11::string::~string((string *)&local_8b8);
          this_local._7_1_ = false;
          builder.Processes.
          super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_898);
        }
        else {
          this_local._7_1_ = true;
          builder.Processes.
          super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        std::
        vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
        ::~vector((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                   *)local_720);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e8);
        poVar4 = std::operator<<((ostream *)local_6e8,"Failed to wait on otool process for:\n  ");
        std::operator<<(poVar4,(string *)file);
        std::__cxx11::ostringstream::str();
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,
                   (string *)
                   &status.
                    super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &status.
                    super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_local._7_1_ = false;
        builder.Processes.
        super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e8);
      }
LAB_005d5a65:
      std::__cxx11::string::~string((string *)&cmdMatch.searchstring);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
      poVar4 = std::operator<<((ostream *)local_258,"Failed to start otool process for:\n  ");
      std::operator<<(poVar4,(string *)file);
      std::__cxx11::ostringstream::str();
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,
                 (string *)((long)&line.field_2 + 8));
      std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
      this_local._7_1_ = false;
      builder.Processes.
      super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
    }
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_e0);
    cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)&process);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Could not find otool",
               (allocator<char> *)
               ((long)&builder.Processes.
                       super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&builder.Processes.
                       super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    this_local._7_1_ = false;
    builder.Processes.
    super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& libs,
  std::vector<std::string>& rpaths)
{
  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("otool", command)) {
    this->SetError("Could not find otool");
    return false;
  }
  command.emplace_back("-l");
  command.emplace_back(file);

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression rpathRegex("^ *cmd LC_RPATH$");
  static const cmsys::RegularExpression loadDylibRegex(
    "^ *cmd LC_LOAD_DYLIB$");
  static const cmsys::RegularExpression pathRegex(
    "^ *path (.*) \\(offset [0-9]+\\)$");
  static const cmsys::RegularExpression nameRegex(
    "^ *name (.*) \\(offset [0-9]+\\)$");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch cmdMatch;
    if (rpathRegex.find(line.c_str(), cmdMatch)) {
      if (!std::getline(*process.OutputStream(), line) ||
          !std::getline(*process.OutputStream(), line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch pathMatch;
      if (pathRegex.find(line.c_str(), pathMatch)) {
        rpaths.push_back(pathMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    } else if (loadDylibRegex.find(line.c_str(), cmdMatch)) {
      if (!std::getline(*process.OutputStream(), line) ||
          !std::getline(*process.OutputStream(), line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch nameMatch;
      if (nameRegex.find(line.c_str(), nameMatch)) {
        libs.push_back(nameMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run otool on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}